

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

mt19937 * libtorrent::aux::random_engine(void)

{
  initializer_list<unsigned_int> __il;
  int iVar1;
  long lVar2;
  long lVar3;
  result_type_conflict local_38;
  result_type_conflict local_34;
  result_type_conflict local_30;
  result_type_conflict local_2c;
  iterator local_28;
  undefined8 local_20;
  
  if (random_engine()::dev == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::dev);
    if (iVar1 != 0) {
      ::std::random_device::random_device(&random_engine::dev);
      __cxa_atexit(::std::random_device::~random_device,&random_engine::dev,&__dso_handle);
      __cxa_guard_release(&random_engine()::dev);
    }
  }
  lVar2 = __tls_get_addr(&PTR_00b96fc0);
  if (*(char *)(lVar2 + 0x20) == '\0') {
    local_38 = ::std::random_device::operator()(&random_engine::dev);
    local_34 = ::std::random_device::operator()(&random_engine::dev);
    local_30 = ::std::random_device::operator()(&random_engine::dev);
    local_2c = ::std::random_device::operator()(&random_engine::dev);
    local_20 = 4;
    local_28 = &local_38;
    lVar2 = __tls_get_addr(&PTR_00b96fc0);
    __il._M_len = 4;
    __il._M_array = &local_38;
    ::std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)(lVar2 + 8),__il);
    __cxa_thread_atexit(::std::seed_seq::~seed_seq,(seed_seq *)(lVar2 + 8),&__dso_handle);
    lVar2 = __tls_get_addr(&PTR_00b96fc0);
    *(undefined1 *)(lVar2 + 0x20) = 1;
  }
  lVar2 = __tls_get_addr(&PTR_00b96fc0);
  if (*(char *)(lVar2 + 0x13b0) == '\0') {
    lVar2 = __tls_get_addr(&PTR_00b96fc0);
    lVar3 = __tls_get_addr(&PTR_00b96fc0);
    ::std::
    mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
    ::mersenne_twister_engine<std::seed_seq,void>
              ((mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
                *)(lVar3 + 0x28),(seed_seq *)(lVar2 + 8));
    lVar2 = __tls_get_addr(&PTR_00b96fc0);
    *(undefined1 *)(lVar2 + 0x13b0) = 1;
  }
  lVar2 = __tls_get_addr(&PTR_00b96fc0);
  return (mt19937 *)(lVar2 + 0x28);
}

Assistant:

std::mt19937& random_engine()
		{
#ifdef TORRENT_BUILD_SIMULATOR
			// make sure random numbers are deterministic. Seed with a fixed number
			static std::mt19937 rng(0x82daf973);
#else

#if TORRENT_BROKEN_RANDOM_DEVICE
			struct {
				std::uint32_t operator()() const
				{
					std::uint32_t ret;
					crypto_random_bytes({reinterpret_cast<char*>(&ret), sizeof(ret)});
					return ret;
				}
			} dev;
#else
			static std::random_device dev;
#endif
#ifdef BOOST_NO_CXX11_THREAD_LOCAL
			static std::seed_seq seed({dev(), dev(), dev(), dev()});
			static std::mt19937 rng(seed);
#else
			thread_local static std::seed_seq seed({dev(), dev(), dev(), dev()});
			thread_local static std::mt19937 rng(seed);
#endif
#endif
			return rng;
		}